

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

Point3f pbrt::weightBoundary(SDVertex *vert,Float beta)

{
  undefined1 auVar1 [16];
  Tuple3<pbrt::Point3,_float> t;
  Tuple3<pbrt::Point3,_float> t_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Tuple3<pbrt::Point3,_float> TVar4;
  Point3<float> c;
  undefined4 in_XMM0_Da;
  undefined8 uVar5;
  Point3<float> PVar6;
  Tuple3<pbrt::Point3,_float> TVar7;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  int valence;
  Point3f p;
  size_type in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  SDVertex *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  float in_stack_fffffffffffffda4;
  Point3f *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined8 in_stack_fffffffffffffdb8;
  float in_stack_fffffffffffffdc0;
  float fVar8;
  undefined4 uStack_23c;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  local_100;
  int local_20;
  undefined4 local_1c;
  undefined8 local_10;
  float local_8;
  
  local_1c = in_XMM0_Da;
  local_20 = SDVertex::valence(in_stack_fffffffffffffd98);
  pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::Point3<float>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                (size_t)in_stack_fffffffffffffda8,
                (polymorphic_allocator<pbrt::Point3<float>_> *)
                CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  data(&local_100);
  SDVertex::oneRing((SDVertex *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    in_stack_fffffffffffffda8);
  uVar5 = 0;
  TVar7.z = in_stack_fffffffffffffdc0;
  TVar7.x = (float)(int)in_stack_fffffffffffffdb8;
  TVar7.y = (float)(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  PVar6 = operator*(in_stack_fffffffffffffda4,TVar7);
  local_8 = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._8_8_ = uVar5;
  auVar3._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_10 = vmovlpd_avx(auVar3);
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  operator[]((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
              *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88);
  uVar5 = 0;
  t.z = in_stack_fffffffffffffdc0;
  t.x = (float)(int)in_stack_fffffffffffffdb8;
  t.y = (float)(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  TVar7 = (Tuple3<pbrt::Point3,_float>)operator*(in_stack_fffffffffffffda4,t);
  fVar8 = (float)uVar5;
  uStack_23c = (undefined4)((ulong)uVar5 >> 0x20);
  auVar2._8_4_ = fVar8;
  auVar2._0_8_ = TVar7._0_8_;
  auVar2._12_4_ = uStack_23c;
  uVar5 = vmovlpd_avx(auVar2);
  c.super_Tuple3<pbrt::Point3,_float>.z = TVar7.z;
  c.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  c.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar5 >> 0x20);
  Tuple3<pbrt::Point3,float>::operator+=((Tuple3<pbrt::Point3,float> *)&local_10,c);
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  operator[]((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
              *)CONCAT44(in_stack_fffffffffffffd94,local_1c),in_stack_fffffffffffffd88);
  uVar5 = 0;
  t_00.z = fVar8;
  t_00.x = (float)(int)TVar7._0_8_;
  t_00.y = (float)(int)((ulong)TVar7._0_8_ >> 0x20);
  TVar7 = (Tuple3<pbrt::Point3,_float>)operator*(in_stack_fffffffffffffda4,t_00);
  auVar1._8_4_ = (int)uVar5;
  auVar1._0_8_ = TVar7._0_8_;
  auVar1._12_4_ = (int)((ulong)uVar5 >> 0x20);
  uVar5 = vmovlpd_avx(auVar1);
  PVar6.super_Tuple3<pbrt::Point3,_float>.z = TVar7.z;
  PVar6.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  PVar6.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar5 >> 0x20);
  Tuple3<pbrt::Point3,float>::operator+=((Tuple3<pbrt::Point3,float> *)&local_10,PVar6);
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  ~InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)CONCAT44(TVar7.z,local_1c));
  TVar4.z = local_8;
  TVar4.x = (float)(undefined4)local_10;
  TVar4.y = (float)local_10._4_4_;
  return (Point3f)TVar4;
}

Assistant:

static Point3f weightBoundary(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - 2 * beta) * vert->p;
    p += beta * pRing[0];
    p += beta * pRing[valence - 1];
    return p;
}